

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparser.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  char *pcVar12;
  undefined8 uVar13;
  long *plVar14;
  long lVar15;
  size_t sVar16;
  undefined8 uVar17;
  char *pcVar18;
  xmlTextReader *reader;
  uint uVar19;
  char *pcVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  xmlNodePtr list;
  char dtdContent [35];
  uint local_10c;
  uint local_f4;
  char *local_c8;
  int iStack_c0;
  char acStack_bc [52];
  undefined8 local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  char local_58 [40];
  
  lVar9 = xmlNewDocNode(0,0,"c","");
  bVar27 = *(long *)(lVar9 + 0x18) != 0;
  if (bVar27) {
    main_cold_1();
  }
  xmlFreeNode(lVar9);
  xmlResetLastError();
  lVar9 = xmlReadDoc("<?xml version=\"1.0\" standalone=\"yes\"?>\n<doc></doc>\n",0,"UTF-8",0);
  if (lVar9 == 0) {
    main_cold_2();
  }
  xmlFreeDoc(lVar9);
  xmlResetLastError();
  lVar10 = xmlReadDoc("<doc/>",0,"#unsupported",0x40);
  if (lVar10 == 0) {
    main_cold_3();
  }
  uVar26 = (ulong)(lVar10 == 0);
  local_60 = (ulong)(lVar9 == 0);
  xmlFreeDoc(lVar10);
  lVar9 = xmlGetLastError();
  if ((((lVar9 == 0) || (*(int *)(lVar9 + 4) != 0x20)) || (*(int *)(lVar9 + 0x10) != 1)) ||
     (iVar3 = strcmp(*(char **)(lVar9 + 8),"Unsupported encoding: #unsupported\n"), iVar3 != 0)) {
    main_cold_4();
    uVar26 = 1;
  }
  lVar9 = xmlReadDoc("<doc/>",0,0,0);
  uVar13 = *(undefined8 *)(lVar9 + 0x18);
  uVar11 = xmlNewReference(lVar9,"lt");
  xmlAddChild(uVar13,uVar11);
  pcVar12 = (char *)xmlNodeGetContent(lVar9);
  iVar3 = strcmp(pcVar12,"<");
  if (iVar3 != 0) {
    main_cold_5();
  }
  (*_xmlFree)(pcVar12);
  xmlFreeDoc(lVar9);
  xmlRegisterInputCallbacks(xmlFileMatch,xmlFileOpen,xmlFileRead,xmlFileClose);
  bVar28 = false;
  lVar9 = xmlReadFile("test/ent1",0,0);
  uVar21 = 1;
  if (lVar9 != 0) {
    lVar10 = xmlDocGetRootElement(lVar9);
    if ((lVar10 == 0) || (iVar4 = xmlStrEqual(*(undefined8 *)(lVar10 + 0x10),"EXAMPLE"), iVar4 == 0)
       ) {
      bVar28 = false;
    }
    else {
      uVar21 = 0;
      bVar28 = true;
    }
  }
  local_68 = uVar26;
  xmlFreeDoc(lVar9);
  xmlPopInputCallbacks();
  if (!bVar28) {
    main_cold_6();
  }
  builtin_strncpy(local_58,"<!ENTITY test \'<elem1/><elem2/>\'>\n",0x23);
  builtin_strncpy(acStack_bc,"c SYSTEM \'entities.dtd\'>\n<doc>&test;</doc>\n",0x2c);
  local_c8 = (char *)0x505954434f44213c;
  iStack_c0._0_1_ = 'E';
  iStack_c0._1_1_ = ' ';
  iStack_c0._2_1_ = 'd';
  iStack_c0._3_1_ = 'o';
  local_70 = (ulong)(iVar3 != 0);
  uVar13 = xmlParserInputBufferCreateStatic(local_58,0x22,0);
  lVar9 = xmlIOParseDTD(0,uVar13,0);
  plVar14 = (long *)xmlNewParserCtxt();
  plVar14[0x35] = lVar9;
  *(code **)(*plVar14 + 0xd0) = testSwitchDtdExtSubset;
  lVar10 = xmlCtxtReadMemory(plVar14,&local_c8,0x37,0,0,6);
  xmlFreeParserCtxt(plVar14);
  lVar15 = xmlGetDocEntity(lVar10,"test");
  bVar28 = *(long *)(*(long *)(lVar15 + 0x18) + 0x40) != 0;
  if (bVar28) {
    main_cold_7();
  }
  *(undefined8 *)(lVar10 + 0x58) = 0;
  xmlFreeDoc(lVar10);
  xmlFreeDtd(lVar9);
  lVar10 = xmlReadDoc("<doc xmlns:a=\'a\'><elem xmlns:b=\'b\'/></doc>",0,0);
  uVar13 = *(undefined8 *)(*(long *)(lVar10 + 0x18) + 0x18);
  lVar15 = xmlNewParserCtxt();
  local_f4 = 0;
  lVar9 = 0;
  do {
    pcVar12 = (&testCtxtParseContent_tests)[lVar9];
    iVar3 = 0;
    do {
      if (iVar3 == 0) {
        uVar11 = xmlNewInputFromString(0,pcVar12,2);
        local_c8 = (char *)xmlCtxtParseContent(lVar15,uVar11,uVar13,0);
      }
      else {
        sVar16 = strlen(pcVar12);
        xmlParseInNodeContext(uVar13,pcVar12,sVar16 & 0xffffffff,0,&local_c8);
      }
      pcVar18 = local_c8;
      uVar11 = xmlBufferCreate();
      uVar17 = xmlSaveToBuffer(uVar11,"UTF-8",0);
      for (; pcVar18 != (char *)0x0; pcVar18 = *(char **)(pcVar18 + 0x30)) {
        xmlSaveTree(uVar17,pcVar18);
      }
      xmlSaveClose(uVar17);
      pcVar18 = (char *)xmlBufferDetach(uVar11);
      xmlBufferFree(uVar11);
      if (((iVar3 == 0) && (*(int *)(lVar15 + 0x230) == 0)) ||
         (iVar4 = strcmp(pcVar18,pcVar12), iVar4 != 0)) {
        pcVar20 = "xmlParseInNodeContext";
        if (iVar3 == 0) {
          pcVar20 = "xmlCtxtParseContent";
        }
        fprintf(_stderr,"%s failed test %d, got:\n%s\n",pcVar20,lVar9,pcVar18);
        local_f4 = 1;
      }
      (*_xmlFree)(pcVar18);
      xmlFreeNodeList();
      bVar29 = iVar3 == 0;
      iVar3 = iVar3 + 1;
    } while (bVar29);
    bVar29 = lVar9 == 0;
    lVar9 = lVar9 + 1;
  } while (bVar29);
  xmlFreeParserCtxt(lVar15);
  xmlFreeDoc(lVar10);
  iVar3 = xmlParseBalancedChunkMemory
                    (0,0,0,0,"start <node xml:lang=\'en\'>abc</node> end",&local_c8);
  if ((((iVar3 == 0) && (local_c8 != (char *)0x0)) &&
      (lVar9 = *(long *)(local_c8 + 0x30), lVar9 != 0)) &&
     ((*(int *)(lVar9 + 8) == 1 && (*(long *)(lVar9 + 0x60) != 0)))) {
    iVar3 = xmlStrEqual(*(undefined8 *)(*(long *)(lVar9 + 0x60) + 0x10),
                        "http://www.w3.org/XML/1998/namespace");
    uVar19 = 0;
    if (iVar3 == 0) goto LAB_00102d1f;
  }
  else {
LAB_00102d1f:
    main_cold_8();
    uVar19 = 1;
  }
  xmlFreeNodeList(local_c8);
  lVar9 = xmlCreatePushParserCtxt(0,0,0,0,0);
  xmlParseChunk(lVar9,"<doc>",5,0);
  iVar3 = 1000000;
  do {
    xmlParseChunk(lVar9,"<elem>text</elem>",0x11,0);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  xmlParseChunk(lVar9,"</doc>",6,1);
  iVar3 = *(int *)(lVar9 + 0x18);
  xmlFreeDoc(*(undefined8 *)(lVar9 + 0x10));
  xmlFreeParserCtxt(lVar9);
  uVar13 = xmlBufferCreate();
  xmlBufferCat(uVar13,"<?xml version=\'1.0\' encoding=\'ISO-8859-1\'?>\n");
  xmlBufferCat(uVar13,"<doc><!-- ");
  iVar4 = 2000;
  do {
    xmlBufferCat(uVar13,"0123456789");
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  xmlBufferCat(uVar13," --></doc>");
  uVar11 = xmlBufferDetach(uVar13);
  xmlBufferFree(uVar13);
  lVar9 = xmlCreatePushParserCtxt(0,0,0,0,0);
  uVar5 = xmlStrlen(uVar11);
  xmlParseChunk(lVar9,uVar11,uVar5,0);
  xmlParseChunk(lVar9,0,0,1);
  xmlFreeDoc(*(undefined8 *)(lVar9 + 0x10));
  xmlFreeParserCtxt(lVar9);
  (*_xmlFree)(uVar11);
  uVar13 = xmlBufferCreate();
  xmlBufferCat(uVar13,"<?xml version=\'1.0\' encoding=\'ISO-8859-1\'?>\n");
  xmlBufferCat(uVar13,"<doc>");
  iVar4 = 2000;
  do {
    xmlBufferCat(uVar13,"0123456789");
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  xmlBufferCat(uVar13,"</doc>");
  uVar11 = xmlBufferDetach(uVar13);
  xmlBufferFree(uVar13);
  lVar9 = xmlCreatePushParserCtxt(0,0,0,0,0);
  uVar5 = xmlStrlen(uVar11);
  xmlParseChunk(lVar9,uVar11,uVar5,1);
  iVar4 = *(int *)(lVar9 + 0x18);
  xmlFreeDoc(*(undefined8 *)(lVar9 + 0x10));
  xmlFreeParserCtxt(lVar9);
  (*_xmlFree)(uVar11);
  uVar1 = 0;
  iVar6 = 0;
  do {
    lVar9 = xmlCreatePushParserCtxt(0,0,0,0,0);
    xmlCtxtSetOptions(lVar9,0x20);
    uVar13 = xmlBufferCreate();
    xmlBufferCCat(uVar13,"<doc>");
    pcVar12 = anon_var_dwarf_308;
    if (iVar6 == 0) {
      pcVar12 = "x";
    }
    xmlBufferCCat(uVar13,pcVar12);
    iVar22 = 2000;
    do {
      xmlBufferCCat(uVar13,"x");
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
    xmlBufferCCat(uVar13,"]");
    uVar11 = xmlBufferDetach(uVar13);
    xmlBufferFree(uVar13);
    uVar5 = xmlStrlen(uVar11);
    xmlParseChunk(lVar9,uVar11,uVar5,0);
    xmlParseChunk(lVar9,"]>xxx</doc>",0xb);
    if (*(int *)(lVar9 + 0x88) != 0x3e) {
      fprintf(_stderr,"xmlParseChunk failed to detect CData end: %d\n");
      uVar1 = 1;
    }
    (*_xmlFree)(uVar11);
    xmlFreeDoc(*(undefined8 *)(lVar9 + 0x10));
    xmlFreeParserCtxt();
    bVar29 = iVar6 == 0;
    iVar6 = iVar6 + 1;
  } while (bVar29);
  lVar9 = htmlReadDoc("<html><body><div id=\'myId\'>Hello, World!</div></body></html>",0,0,0);
  if (lVar9 == 0) {
    main_cold_10();
    local_10c = 1;
  }
  else {
    lVar10 = xmlGetID(lVar9,"myId");
    if (lVar10 == 0) {
      main_cold_9();
      local_10c = 1;
    }
    else {
      xmlFreeDoc(lVar9);
      local_10c = 0;
    }
  }
  lVar10 = htmlCreatePushParserCtxt(0,0,0,0,0,1);
  htmlParseChunk(lVar10,anon_var_dwarf_390,4,1);
  lVar9 = *(long *)(lVar10 + 0x10);
  iVar6 = xmlStrEqual(*(undefined8 *)(lVar9 + 0x70),"UTF-8");
  if (iVar6 == 0) {
    main_cold_11();
  }
  uVar26 = (ulong)(iVar6 == 0);
  lVar15 = xmlDocGetRootElement(lVar9);
  iVar6 = xmlStrEqual(*(undefined8 *)
                       (*(long *)(*(long *)(*(long *)(lVar15 + 0x18) + 0x18) + 0x18) + 0x50),
                      anon_var_dwarf_390);
  if (iVar6 == 0) {
    main_cold_12();
    uVar26 = 1;
  }
  xmlFreeDoc(lVar9);
  htmlFreeParserCtxt(lVar10);
  uVar13 = xmlBufferCreate();
  xmlBufferCCat(uVar13,"<?xml version=\'1.0\' encoding=\'ISO-8859-1\'?>\n");
  xmlBufferCCat(uVar13,"<doc>");
  iVar6 = 0x2000;
  do {
    xmlBufferCCat(uVar13,"x");
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  local_78 = uVar26;
  xmlBufferCCat(uVar13,"</doc>");
  uVar11 = xmlBufferDetach(uVar13);
  xmlBufferFree(uVar13);
  uVar13 = xmlReaderForDoc(uVar11,0,0,0);
  xmlTextReaderRead(uVar13);
  uVar17 = xmlTextReaderConstEncoding(uVar13);
  iVar6 = xmlStrEqual(uVar17,"ISO-8859-1");
  if (iVar6 == 0) {
    main_cold_13();
  }
  xmlFreeTextReader(uVar13);
  (*_xmlFree)(uVar11);
  uVar13 = xmlReaderForDoc("<d>x<e>y</e><f>z</f></d>",0,0,0);
  xmlTextReaderRead(uVar13);
  uVar11 = xmlTextReaderReadOuterXml(uVar13);
  iVar22 = xmlStrEqual(uVar11,"<d>x<e>y</e><f>z</f></d>");
  if (iVar22 == 0) {
    main_cold_14();
  }
  uVar26 = (ulong)(iVar22 == 0);
  (*_xmlFree)(uVar11);
  uVar11 = xmlTextReaderReadInnerXml(uVar13);
  iVar22 = xmlStrEqual(uVar11,"x<e>y</e><f>z</f>");
  if (iVar22 == 0) {
    main_cold_15();
    uVar26 = 1;
  }
  (*_xmlFree)(uVar11);
  uVar11 = xmlTextReaderReadString(uVar13);
  iVar22 = xmlStrEqual(uVar11,"xyz");
  if (iVar22 == 0) {
    main_cold_16();
    uVar26 = 1;
  }
  (*_xmlFree)(uVar11);
  xmlFreeTextReader(uVar13);
  uVar13 = 0;
  reader = (xmlTextReader *)
           xmlReaderForDoc("<d>\n  x<e a=\'v\'>y</e><f>z</f>\n  <![CDATA[cdata]]>\n  <!-- comment -->\n  <?pi content?>\n  <empty/>\n</d>"
                           ,0,0,0);
  iVar22 = xmlTextReaderRead(reader);
  if (0 < iVar22) {
    uVar13 = 0;
    do {
      iVar22 = testReaderNode(reader);
      if (iVar22 != 0) {
        uVar13 = 1;
        break;
      }
      iVar22 = xmlTextReaderMoveToFirstAttribute(reader);
      if (0 < iVar22) {
        do {
          iVar22 = testReaderNode(reader);
          if (iVar22 != 0) {
            uVar13 = 1;
            break;
          }
          iVar22 = xmlTextReaderMoveToNextAttribute(reader);
        } while (0 < iVar22);
        xmlTextReaderMoveToElement(reader);
      }
      iVar22 = xmlTextReaderRead(reader);
    } while (0 < iVar22);
  }
  local_88 = uVar13;
  xmlFreeTextReader(reader);
  uVar13 = xmlReaderForDoc("<doc xmlns:xi=\'http://www.w3.org/2001/XInclude\'>\n  <xi:include/>\n</doc>\n"
                           ,0,0,0x400);
  xmlTextReaderSetErrorHandler(uVar13,testReaderError,&local_c8);
  local_c8 = (char *)0x0;
  iStack_c0 = 0;
  do {
    iVar22 = xmlTextReaderRead(uVar13);
  } while (0 < iVar22);
  if (local_c8 != (char *)0x0) {
    pcVar12 = strstr(local_c8,"href or xpointer");
    uVar23 = 0;
    if (pcVar12 != (char *)0x0) goto LAB_0010336e;
  }
  main_cold_17();
  uVar23 = 1;
LAB_0010336e:
  (*_xmlFree)(local_c8);
  xmlFreeTextReader(uVar13);
  uVar13 = xmlReaderForDoc("<doc xmlns:xi=\'http://www.w3.org/2001/XInclude\'>\n  <xi:include/>\n</doc>\n"
                           ,0,0,0x400);
  xmlTextReaderSetStructuredErrorHandler(uVar13,testStructuredReaderError,&local_c8);
  local_c8 = (char *)0x0;
  iStack_c0 = 0;
  do {
    iVar22 = xmlTextReaderRead(uVar13);
  } while (0 < iVar22);
  if (((iStack_c0 != 0x643) || (local_c8 == (char *)0x0)) ||
     (pcVar12 = strstr(local_c8,"href or xpointer"), pcVar12 == (char *)0x0)) {
    main_cold_18();
    uVar23 = 1;
  }
  local_80 = uVar26;
  (*_xmlFree)(local_c8);
  xmlFreeTextReader(uVar13);
  uVar13 = xmlOutputBufferCreateIO(testWriterIOWrite,testWriterIOClose,0,0);
  uVar13 = xmlNewTextWriter(uVar13);
  xmlTextWriterStartDocument(uVar13,"1.0","UTF-8",0);
  xmlTextWriterStartElement(uVar13,"elem");
  xmlTextWriterEndElement(uVar13);
  xmlTextWriterEndDocument(uVar13);
  uVar7 = xmlTextWriterClose(uVar13);
  if (uVar7 != 0x5f1) {
    fprintf(_stderr,"xmlTextWriterClose reported wrong error %d\n",(ulong)uVar7);
  }
  xmlFreeTextWriter(uVar13);
  lVar9 = 0x10;
  uVar2 = 0;
  do {
    lVar10 = *(long *)((long)&testCtxtParseContent_tests + lVar9);
    uVar13 = *(undefined8 *)((long)&PTR_anon_var_dwarf_1e6_00106c68 + lVar9);
    uVar11 = xmlBuildRelativeURI(lVar10,uVar13);
    lVar15 = *(long *)((long)&testBuildRelativeUri_tests + lVar9);
    if (*(long *)((long)&testBuildRelativeUri_tests + lVar9) == 0) {
      lVar15 = lVar10;
    }
    iVar22 = xmlStrEqual(uVar11,lVar15);
    if (iVar22 == 0) {
      fprintf(_stderr,"xmlBuildRelativeURI failed uri=%s base=%s result=%s expected=%s\n",lVar10,
              uVar13,uVar11,lVar15);
      uVar2 = 1;
    }
    (*_xmlFree)(uVar11);
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0x130);
  uVar13 = xmlNewParserCtxt();
  xmlCtxtSetCharEncConvImpl(uVar13,rot13ConvImpl,0);
  charEncConvImplError = 0;
  uVar11 = xmlCtxtReadDoc(uVar13,"<?kzy irefvba=\'1.0\'?><qbp/>",0,"rot13",0);
  uVar25 = (uint)charEncConvImplError;
  xmlFreeParserCtxt(uVar13);
  lVar9 = xmlDocGetRootElement(uVar11);
  if ((lVar9 == 0) || (iVar22 = strcmp(*(char **)(lVar9 + 0x10),"doc"), iVar22 != 0)) {
    main_cold_19();
    uVar25 = 1;
  }
  uVar8 = (uint)local_60;
  uVar24 = (uint)local_68 | (uint)local_70;
  xmlFreeDoc(uVar11);
  return uVar1 | uVar2 |
         uVar25 | local_f4 |
         (uint)local_78 | (uint)(iVar6 == 0) | (uint)local_80 | (uint)local_88 | uVar23 |
         (uint)(uVar7 != 0x5f1) |
         uVar21 | bVar28 | uVar19 | uVar24 | uVar8 | bVar27 | (uint)(iVar3 == 0) |
         iVar4 == 0 | local_10c;
}

Assistant:

int
main(void) {
    int err = 0;

    err |= testNewDocNode();
    err |= testStandaloneWithEncoding();
    err |= testUnsupportedEncoding();
    err |= testNodeGetContent();
    err |= testCFileIO();
#ifdef LIBXML_VALID_ENABLED
    err |= testSwitchDtd();
#endif
#ifdef LIBXML_OUTPUT_ENABLED
    err |= testCtxtParseContent();
#endif
#ifdef LIBXML_SAX1_ENABLED
    err |= testBalancedChunk();
#endif
#ifdef LIBXML_PUSH_ENABLED
    err |= testHugePush();
    err |= testHugeEncodedChunk();
    err |= testPushCDataEnd();
#endif
#ifdef LIBXML_HTML_ENABLED
    err |= testHtmlIds();
#ifdef LIBXML_PUSH_ENABLED
    err |= testHtmlPushWithEncoding();
#endif
#endif
#ifdef LIBXML_READER_ENABLED
    err |= testReaderEncoding();
    err |= testReaderContent();
    err |= testReader();
#ifdef LIBXML_XINCLUDE_ENABLED
    err |= testReaderXIncludeError();
#endif
#endif
#ifdef LIBXML_WRITER_ENABLED
    err |= testWriterClose();
#endif
    err |= testBuildRelativeUri();
#if defined(_WIN32) || defined(__CYGWIN__)
    err |= testWindowsUri();
#endif
    err |= testCharEncConvImpl();

    return err;
}